

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID id;
  
  if (GImGui->CurrentWindow->SkipItems != false) {
    return false;
  }
  if (str_id == (char *)0x0) {
    id = (GImGui->LastItemData).ID;
  }
  else {
    id = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
  }
  bVar1 = IsMouseReleased(popup_flags & 0x1f);
  if (bVar1) {
    bVar1 = IsItemHovered(0x20);
    if (bVar1) {
      OpenPopupEx(id,popup_flags);
    }
  }
  bVar1 = BeginPopupEx(id,0x141);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}